

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O3

void __thiscall toml::detail::region::region(region *this,region *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (param_2->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (param_2->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (param_2->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar4;
  (this->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  (param_2->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  paVar1 = &(this->source_name_).field_2;
  (this->source_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->source_name_)._M_dataplus._M_p;
  paVar2 = &(param_2->source_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&(param_2->source_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->source_name_).field_2 + 8) = uVar6;
  }
  else {
    (this->source_name_)._M_dataplus._M_p = pcVar3;
    (this->source_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->source_name_)._M_string_length = (param_2->source_name_)._M_string_length;
  (param_2->source_name_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->source_name_)._M_string_length = 0;
  (param_2->source_name_).field_2._M_local_buf[0] = '\0';
  this->last_column_ = param_2->last_column_;
  sVar7 = param_2->length_;
  sVar8 = param_2->first_;
  sVar9 = param_2->first_line_;
  sVar10 = param_2->first_column_;
  sVar11 = param_2->last_line_;
  this->last_ = param_2->last_;
  this->last_line_ = sVar11;
  this->first_line_ = sVar9;
  this->first_column_ = sVar10;
  this->length_ = sVar7;
  this->first_ = sVar8;
  return;
}

Assistant:

region(region&&)      = default;